

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O1

bool __thiscall TTD::ExecutionInfoManager::TryFindAndSetPreviousBP(ExecutionInfoManager *this)

{
  TTD_LOG_PTR_ID TVar1;
  int64 iVar2;
  int64 iVar3;
  int64 iVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  
  TVar1 = (this->m_continueBreakPoint).m_sourceScriptLogId;
  if (TVar1 != 0) {
    (this->m_pendingTTDBP).m_sourceScriptLogId = TVar1;
    iVar2 = (this->m_continueBreakPoint).m_etime;
    iVar3 = (this->m_continueBreakPoint).m_ftime;
    iVar4 = (this->m_continueBreakPoint).m_ltime;
    (this->m_pendingTTDBP).m_bpId = (this->m_continueBreakPoint).m_bpId;
    (this->m_pendingTTDBP).m_etime = iVar2;
    (this->m_pendingTTDBP).m_ftime = iVar3;
    (this->m_pendingTTDBP).m_ltime = iVar4;
    (this->m_pendingTTDBP).m_topLevelBodyId = (this->m_continueBreakPoint).m_topLevelBodyId;
    uVar5 = (this->m_continueBreakPoint).m_functionColumn;
    uVar6 = (this->m_continueBreakPoint).m_line;
    uVar7 = (this->m_continueBreakPoint).m_column;
    (this->m_pendingTTDBP).m_functionLine = (this->m_continueBreakPoint).m_functionLine;
    (this->m_pendingTTDBP).m_functionColumn = uVar5;
    (this->m_pendingTTDBP).m_line = uVar6;
    (this->m_pendingTTDBP).m_column = uVar7;
    (this->m_continueBreakPoint).m_sourceScriptLogId = 0;
    *(undefined4 *)&(this->m_continueBreakPoint).m_bpId = 0xffffffff;
    *(undefined4 *)((long)&(this->m_continueBreakPoint).m_bpId + 4) = 0xffffffff;
    *(undefined4 *)&(this->m_continueBreakPoint).m_etime = 0xffffffff;
    *(undefined4 *)((long)&(this->m_continueBreakPoint).m_etime + 4) = 0xffffffff;
    (this->m_continueBreakPoint).m_ftime = 0;
    (this->m_continueBreakPoint).m_ltime = 0;
    (this->m_continueBreakPoint).m_topLevelBodyId = 0;
    (this->m_continueBreakPoint).m_functionLine = 0;
    (this->m_continueBreakPoint).m_functionColumn = 0;
    (this->m_continueBreakPoint).m_line = 0;
    (this->m_continueBreakPoint).m_column = 0;
  }
  return TVar1 != 0;
}

Assistant:

bool ExecutionInfoManager::TryFindAndSetPreviousBP()
    {
        if(!this->m_continueBreakPoint.HasValue())
        {
            return false;
        }
        else
        {
            this->m_pendingTTDBP.SetLocationCopy(this->m_continueBreakPoint);
            this->m_continueBreakPoint.Clear();

            return true;
        }
    }